

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btMultiBodyConstraint.cpp
# Opt level: O0

btScalar __thiscall
btMultiBodyConstraint::fillMultiBodyConstraint
          (btMultiBodyConstraint *this,btMultiBodySolverConstraint *solverConstraint,
          btMultiBodyJacobianData *data,btScalar *jacOrgA,btScalar *jacOrgB,
          btVector3 *contactNormalOnB,btVector3 *posAworld,btVector3 *posBworld,btScalar posError,
          btContactSolverInfo *infoGlobal,btScalar lowerLimit,btScalar upperLimit,
          btScalar relaxation,bool isFriction,btScalar desiredVelocity,btScalar cfmSlip)

{
  int iVar1;
  btTransform *pbVar2;
  float *pfVar3;
  btMultibodyLink *pbVar4;
  btScalar *pbVar5;
  long in_RCX;
  btAlignedObjectArray<float> *in_RDX;
  int *in_RSI;
  long in_RDI;
  long in_R8;
  btVector3 *in_R9;
  float in_XMM0_Da;
  btScalar bVar6;
  btScalar bVar7;
  float fVar8;
  int in_XMM1_Da;
  int in_XMM2_Da;
  float in_XMM3_Da;
  float in_XMM4_Da;
  btVector3 bVar9;
  btMultiBody *in_stack_00000010;
  long in_stack_00000018;
  byte in_stack_00000020;
  btScalar velocityImpulse;
  btScalar penetrationImpulse;
  btScalar erp;
  btScalar velocityError;
  btScalar positionalError;
  int i_5;
  btScalar *jacB_1;
  int i_4;
  btScalar *jacA_1;
  btVector3 vel2;
  btVector3 vel1;
  int ndofB;
  int ndofA;
  btScalar rel_vel;
  btScalar penetration;
  btScalar d;
  btScalar l_1;
  btScalar j_1;
  int i_3;
  int ndofB_2;
  btScalar l;
  btScalar j;
  int i_2;
  int ndofA_2;
  btScalar *deltaVelB;
  btScalar *deltaVelA;
  btScalar *jacA;
  btScalar *jacB;
  btScalar denom1;
  btScalar denom0;
  btVector3 vec;
  btVector3 torqueAxis1_1;
  btVector3 torqueAxis1;
  btScalar *delta_1;
  int i_1;
  int ndofB_1;
  btVector3 torqueAxis0_1;
  btVector3 torqueAxis0;
  btScalar *delta;
  btScalar *jac1;
  int i;
  int ndofA_1;
  btVector3 rel_pos2;
  btVector3 rel_pos1;
  btRigidBody *rb1;
  btRigidBody *rb0;
  btSolverBody *bodyB;
  btSolverBody *bodyA;
  btMultiBody *multiBodyB;
  btMultiBody *multiBodyA;
  undefined8 in_stack_fffffffffffffbc8;
  btMultiBody *in_stack_fffffffffffffbd0;
  btVector3 *in_stack_fffffffffffffbd8;
  undefined4 in_stack_fffffffffffffbe0;
  undefined4 in_stack_fffffffffffffbe4;
  float fVar10;
  int in_stack_fffffffffffffbec;
  btAlignedObjectArray<float> *in_stack_fffffffffffffbf0;
  btAlignedObjectArray<float> *in_stack_fffffffffffffc18;
  undefined4 in_stack_fffffffffffffc20;
  undefined4 in_stack_fffffffffffffc24;
  btVector3 *in_stack_fffffffffffffc28;
  btAlignedObjectArray<float> *normal;
  btAlignedObjectArray<float> *in_stack_fffffffffffffc30;
  undefined8 in_stack_fffffffffffffc38;
  btMultiBody *pbVar11;
  int link;
  btMultiBody *in_stack_fffffffffffffc40;
  btMultiBody *in_stack_fffffffffffffc50;
  undefined4 in_stack_fffffffffffffc58;
  float in_stack_fffffffffffffc5c;
  btRigidBody *local_370;
  btRigidBody *local_368;
  btSolverBody *local_360;
  btSolverBody *local_358;
  float local_348;
  btVector3 local_33c;
  int local_32c;
  float *local_328;
  btVector3 local_31c;
  int local_30c;
  float *local_308;
  btVector3 local_2fc;
  btVector3 local_2ec;
  int local_2dc;
  int local_2d8;
  float local_2d4;
  float local_2d0;
  float local_2cc;
  btScalar local_2c8 [4];
  btScalar local_2b8 [4];
  float local_2a8;
  float local_2a4;
  int local_2a0;
  int local_29c;
  btScalar local_298 [4];
  float local_288;
  float local_284;
  int local_280;
  int local_27c;
  float *local_278;
  float *local_270;
  float *local_268;
  float *local_260;
  float local_254;
  float local_250;
  btVector3 local_24c;
  undefined1 local_23c [16];
  undefined1 local_22c [16];
  btScalar local_21c;
  btScalar local_218;
  btScalar local_214;
  btScalar local_210 [4];
  btScalar local_200 [4];
  btVector3 local_1f0;
  btScalar local_1e0 [4];
  undefined1 local_1d0 [16];
  undefined1 local_1c0 [16];
  btScalar local_1b0 [4];
  float *local_1a0;
  undefined4 local_198;
  btScalar local_194 [4];
  int local_184;
  undefined4 local_180;
  undefined4 local_17c;
  int local_178;
  btScalar local_174 [4];
  btScalar local_164 [4];
  btScalar local_154;
  btScalar local_150;
  btScalar local_14c;
  btScalar local_148 [4];
  btVector3 local_138;
  undefined1 local_128 [16];
  undefined1 local_118 [16];
  float *local_108;
  undefined4 local_fc;
  float *local_f8;
  int local_f0;
  undefined4 local_ec;
  undefined4 local_e8;
  int local_e4;
  btVector3 in_stack_ffffffffffffff20;
  btVector3 in_stack_ffffffffffffff30;
  btMultiBody *in_stack_ffffffffffffff40;
  btScalar local_b8 [2];
  btScalar local_b0 [2];
  btScalar local_a8 [2];
  btMultiBody *local_a0;
  btScalar local_98 [2];
  btVector3 local_90;
  btRigidBody *local_80;
  btRigidBody *local_78;
  btSolverBody *local_70;
  btSolverBody *local_68;
  btMultiBody *local_60;
  btMultiBody *local_58;
  float local_48;
  byte local_41;
  float local_40;
  int local_3c;
  int local_38;
  float local_34;
  btVector3 *local_30;
  long local_28;
  long local_20;
  btAlignedObjectArray<float> *local_18;
  int *local_10;
  
  local_41 = in_stack_00000020 & 1;
  *(undefined8 *)(in_RSI + 0x2c) = *(undefined8 *)(in_RDI + 8);
  *(undefined8 *)(in_RSI + 0x30) = *(undefined8 *)(in_RDI + 0x10);
  in_RSI[0x2e] = *(int *)(in_RDI + 0x18);
  in_RSI[0x32] = *(int *)(in_RDI + 0x1c);
  local_58 = *(btMultiBody **)(in_RSI + 0x2c);
  local_60 = *(btMultiBody **)(in_RSI + 0x30);
  local_48 = in_XMM4_Da;
  local_40 = in_XMM3_Da;
  local_3c = in_XMM2_Da;
  local_38 = in_XMM1_Da;
  local_34 = in_XMM0_Da;
  local_30 = in_R9;
  local_28 = in_R8;
  local_20 = in_RCX;
  local_18 = in_RDX;
  local_10 = in_RSI;
  if (local_58 == (btMultiBody *)0x0) {
    local_358 = btAlignedObjectArray<btSolverBody>::at
                          (*(btAlignedObjectArray<btSolverBody> **)(in_RDX + 6),in_RSI[0x2a]);
  }
  else {
    local_358 = (btSolverBody *)0x0;
  }
  local_68 = local_358;
  if (local_60 == (btMultiBody *)0x0) {
    local_360 = btAlignedObjectArray<btSolverBody>::at
                          (*(btAlignedObjectArray<btSolverBody> **)(local_18 + 6),local_10[0x2f]);
  }
  else {
    local_360 = (btSolverBody *)0x0;
  }
  local_70 = local_360;
  if (local_58 == (btMultiBody *)0x0) {
    local_368 = local_68->m_originalBody;
  }
  else {
    local_368 = (btRigidBody *)0x0;
  }
  local_78 = local_368;
  if (local_60 == (btMultiBody *)0x0) {
    local_370 = local_360->m_originalBody;
  }
  else {
    local_370 = (btRigidBody *)0x0;
  }
  local_80 = local_370;
  btVector3::btVector3(&local_90);
  btVector3::btVector3((btVector3 *)&local_a0);
  if (local_68 != (btSolverBody *)0x0) {
    pbVar2 = btSolverBody::getWorldTransform(local_68);
    btTransform::getOrigin(pbVar2);
    bVar9 = operator-((btVector3 *)CONCAT44(in_stack_fffffffffffffbe4,in_stack_fffffffffffffbe0),
                      in_stack_fffffffffffffbd8);
    local_b0 = bVar9.m_floats._0_8_;
    local_90.m_floats[0] = local_b0[0];
    local_90.m_floats[1] = local_b0[1];
    local_a8 = bVar9.m_floats._8_8_;
    local_90.m_floats[2] = local_a8[0];
    local_90.m_floats[3] = local_a8[1];
  }
  if (local_70 != (btSolverBody *)0x0) {
    pbVar2 = btSolverBody::getWorldTransform(local_70);
    btTransform::getOrigin(pbVar2);
    bVar9 = operator-((btVector3 *)CONCAT44(in_stack_fffffffffffffbe4,in_stack_fffffffffffffbe0),
                      in_stack_fffffffffffffbd8);
    local_a0 = bVar9.m_floats._0_8_;
    local_b8 = bVar9.m_floats._8_8_;
    local_98[0] = local_b8[0];
    local_98[1] = local_b8[1];
    in_stack_ffffffffffffff40 = local_a0;
  }
  link = (int)((ulong)in_stack_fffffffffffffc38 >> 0x20);
  iVar1 = (int)((ulong)in_stack_fffffffffffffbc8 >> 0x20);
  if (local_58 == (btMultiBody *)0x0) {
    local_128 = (undefined1  [16])
                btVector3::cross((btVector3 *)
                                 CONCAT44(in_stack_fffffffffffffbe4,in_stack_fffffffffffffbe0),
                                 in_stack_fffffffffffffbd8);
    if (local_78 == (btRigidBody *)0x0) {
      local_14c = 0.0;
      local_150 = 0.0;
      local_154 = 0.0;
      btVector3::btVector3(&local_138,&local_14c,&local_150,&local_154);
    }
    else {
      btRigidBody::getInvInertiaTensorWorld(local_78);
      local_148 = (btScalar  [4])
                  ::operator*((btMatrix3x3 *)
                              CONCAT44(in_stack_fffffffffffffbe4,in_stack_fffffffffffffbe0),
                              in_stack_fffffffffffffbd8);
      btRigidBody::getAngularFactor(local_78);
      local_138 = ::operator*((btVector3 *)
                              CONCAT44(in_stack_fffffffffffffbe4,in_stack_fffffffffffffbe0),
                              in_stack_fffffffffffffbd8);
    }
    *(undefined8 *)(local_10 + 0x14) = local_138.m_floats._0_8_;
    *(undefined8 *)(local_10 + 0x16) = local_138.m_floats._8_8_;
    *(undefined8 *)(local_10 + 4) = local_128._0_8_;
    *(undefined8 *)(local_10 + 6) = local_128._8_8_;
    *(undefined8 *)(local_10 + 8) = *(undefined8 *)local_30->m_floats;
    *(undefined8 *)(local_10 + 10) = *(undefined8 *)(local_30->m_floats + 2);
  }
  else {
    if (local_10[0x2e] < 0) {
      btMultiBody::getBasePos(local_58);
      in_stack_ffffffffffffff30 =
           operator-((btVector3 *)CONCAT44(in_stack_fffffffffffffbe4,in_stack_fffffffffffffbe0),
                     in_stack_fffffffffffffbd8);
      local_90.m_floats._0_8_ = in_stack_ffffffffffffff30.m_floats._0_8_;
      local_90.m_floats._8_8_ = in_stack_ffffffffffffff30.m_floats._8_8_;
    }
    else {
      pbVar4 = btMultiBody::getLink(in_stack_fffffffffffffbd0,iVar1);
      btTransform::getOrigin(&pbVar4->m_cachedWorldTransform);
      in_stack_ffffffffffffff20 =
           operator-((btVector3 *)CONCAT44(in_stack_fffffffffffffbe4,in_stack_fffffffffffffbe0),
                     in_stack_fffffffffffffbd8);
      local_90.m_floats._0_8_ = in_stack_ffffffffffffff20.m_floats._0_8_;
      local_90.m_floats._8_8_ = in_stack_ffffffffffffff20.m_floats._8_8_;
    }
    local_e4 = btMultiBody::getNumDofs(local_58);
    local_e4 = local_e4 + 6;
    iVar1 = btMultiBody::getCompanionId(local_58);
    *local_10 = iVar1;
    if (*local_10 < 0) {
      iVar1 = btAlignedObjectArray<float>::size(local_18 + 2);
      *local_10 = iVar1;
      btMultiBody::setCompanionId(local_58,*local_10);
      btAlignedObjectArray<float>::size(local_18 + 2);
      local_e8 = 0;
      btAlignedObjectArray<float>::resize
                (in_stack_fffffffffffffbf0,in_stack_fffffffffffffbec,
                 (float *)CONCAT44(in_stack_fffffffffffffbe4,in_stack_fffffffffffffbe0));
    }
    iVar1 = btAlignedObjectArray<float>::size(local_18);
    local_10[1] = iVar1;
    btAlignedObjectArray<float>::size(local_18);
    local_ec = 0;
    btAlignedObjectArray<float>::resize
              (in_stack_fffffffffffffbf0,in_stack_fffffffffffffbec,
               (float *)CONCAT44(in_stack_fffffffffffffbe4,in_stack_fffffffffffffbe0));
    link = (int)((ulong)in_stack_fffffffffffffc38 >> 0x20);
    if (local_20 == 0) {
      local_f8 = btAlignedObjectArray<float>::operator[](local_18,local_10[1]);
      iVar1 = (int)((ulong)(local_18 + 4) >> 0x20);
      in_stack_fffffffffffffbd0 = (btMultiBody *)(local_18 + 5);
      btMultiBody::fillContactJacobianMultiDof
                (in_stack_fffffffffffffc40,link,(btVector3 *)in_stack_fffffffffffffc30,
                 in_stack_fffffffffffffc28,
                 (btScalar *)CONCAT44(in_stack_fffffffffffffc24,in_stack_fffffffffffffc20),
                 in_stack_fffffffffffffc18,
                 (btAlignedObjectArray<btVector3> *)in_stack_fffffffffffffc50,
                 (btAlignedObjectArray<btMatrix3x3> *)
                 CONCAT44(in_stack_fffffffffffffc5c,in_stack_fffffffffffffc58));
    }
    else {
      local_f0 = 0;
      while( true ) {
        link = (int)((ulong)in_stack_fffffffffffffc38 >> 0x20);
        iVar1 = (int)((ulong)in_stack_fffffffffffffbc8 >> 0x20);
        if (local_e4 <= local_f0) break;
        in_stack_fffffffffffffc5c = *(float *)(local_20 + (long)local_f0 * 4);
        pfVar3 = btAlignedObjectArray<float>::operator[](local_18,local_10[1] + local_f0);
        *pfVar3 = in_stack_fffffffffffffc5c;
        local_f0 = local_f0 + 1;
      }
    }
    btAlignedObjectArray<float>::size(local_18 + 1);
    local_fc = 0;
    btAlignedObjectArray<float>::resize
              (in_stack_fffffffffffffbf0,in_stack_fffffffffffffbec,
               (float *)CONCAT44(in_stack_fffffffffffffbe4,in_stack_fffffffffffffbe0));
    local_108 = btAlignedObjectArray<float>::operator[](local_18 + 1,local_10[1]);
    in_stack_fffffffffffffc50 = local_58;
    btAlignedObjectArray<float>::operator[](local_18,local_10[1]);
    btMultiBody::calcAccelerationDeltasMultiDof
              (in_stack_ffffffffffffff40,in_stack_ffffffffffffff30.m_floats._8_8_,
               in_stack_ffffffffffffff30.m_floats._0_8_,in_stack_ffffffffffffff20.m_floats._8_8_,
               in_stack_ffffffffffffff20.m_floats._0_8_);
    local_118 = (undefined1  [16])
                btVector3::cross((btVector3 *)
                                 CONCAT44(in_stack_fffffffffffffbe4,in_stack_fffffffffffffbe0),
                                 in_stack_fffffffffffffbd8);
    *(undefined8 *)(local_10 + 4) = local_118._0_8_;
    *(undefined8 *)(local_10 + 6) = local_118._8_8_;
    *(undefined8 *)(local_10 + 8) = *(undefined8 *)local_30->m_floats;
    *(undefined8 *)(local_10 + 10) = *(undefined8 *)(local_30->m_floats + 2);
  }
  if (local_60 == (btMultiBody *)0x0) {
    local_1e0 = (btScalar  [4])
                btVector3::cross((btVector3 *)
                                 CONCAT44(in_stack_fffffffffffffbe4,in_stack_fffffffffffffbe0),
                                 in_stack_fffffffffffffbd8);
    if (local_80 == (btRigidBody *)0x0) {
      local_214 = 0.0;
      local_218 = 0.0;
      local_21c = 0.0;
      btVector3::btVector3(&local_1f0,&local_214,&local_218,&local_21c);
    }
    else {
      btRigidBody::getInvInertiaTensorWorld(local_80);
      local_210 = (btScalar  [4])operator-((btVector3 *)in_stack_fffffffffffffbd0);
      local_200 = (btScalar  [4])
                  ::operator*((btMatrix3x3 *)
                              CONCAT44(in_stack_fffffffffffffbe4,in_stack_fffffffffffffbe0),
                              in_stack_fffffffffffffbd8);
      btRigidBody::getAngularFactor(local_80);
      local_1f0 = ::operator*((btVector3 *)
                              CONCAT44(in_stack_fffffffffffffbe4,in_stack_fffffffffffffbe0),
                              in_stack_fffffffffffffbd8);
    }
    *(undefined8 *)(local_10 + 0x18) = local_1f0.m_floats._0_8_;
    *(undefined8 *)(local_10 + 0x1a) = local_1f0.m_floats._8_8_;
    local_22c = (undefined1  [16])operator-((btVector3 *)in_stack_fffffffffffffbd0);
    *(undefined8 *)(local_10 + 0xc) = local_22c._0_8_;
    *(undefined8 *)(local_10 + 0xe) = local_22c._8_8_;
    local_23c = (undefined1  [16])operator-((btVector3 *)in_stack_fffffffffffffbd0);
    *(undefined8 *)(local_10 + 0x10) = local_23c._0_8_;
    *(undefined8 *)(local_10 + 0x12) = local_23c._8_8_;
  }
  else {
    if (local_10[0x32] < 0) {
      in_stack_fffffffffffffc40 = in_stack_00000010;
      btMultiBody::getBasePos(local_60);
      bVar9 = operator-((btVector3 *)CONCAT44(in_stack_fffffffffffffbe4,in_stack_fffffffffffffbe0),
                        in_stack_fffffffffffffbd8);
      local_164._0_8_ = bVar9.m_floats._0_8_;
      local_a0 = (btMultiBody *)local_164._0_8_;
      local_164._8_8_ = bVar9.m_floats._8_8_;
      local_98[0] = local_164[2];
      local_98[1] = local_164[3];
      local_164 = bVar9.m_floats;
    }
    else {
      pbVar11 = in_stack_00000010;
      pbVar4 = btMultiBody::getLink(in_stack_fffffffffffffbd0,iVar1);
      link = (int)((ulong)pbVar11 >> 0x20);
      btTransform::getOrigin(&pbVar4->m_cachedWorldTransform);
      bVar9 = operator-((btVector3 *)CONCAT44(in_stack_fffffffffffffbe4,in_stack_fffffffffffffbe0),
                        in_stack_fffffffffffffbd8);
      local_174._0_8_ = bVar9.m_floats._0_8_;
      local_a0 = (btMultiBody *)local_174._0_8_;
      local_174._8_8_ = bVar9.m_floats._8_8_;
      local_98[0] = local_174[2];
      local_98[1] = local_174[3];
      local_174 = bVar9.m_floats;
    }
    local_178 = btMultiBody::getNumDofs(local_60);
    local_178 = local_178 + 6;
    iVar1 = btMultiBody::getCompanionId(local_60);
    local_10[2] = iVar1;
    if (local_10[2] < 0) {
      iVar1 = btAlignedObjectArray<float>::size(local_18 + 2);
      local_10[2] = iVar1;
      btMultiBody::setCompanionId(local_60,local_10[2]);
      in_stack_fffffffffffffc30 = local_18 + 2;
      btAlignedObjectArray<float>::size(local_18 + 2);
      local_17c = 0;
      btAlignedObjectArray<float>::resize
                (in_stack_fffffffffffffbf0,in_stack_fffffffffffffbec,
                 (float *)CONCAT44(in_stack_fffffffffffffbe4,in_stack_fffffffffffffbe0));
    }
    iVar1 = btAlignedObjectArray<float>::size(local_18);
    local_10[3] = iVar1;
    normal = local_18;
    btAlignedObjectArray<float>::size(local_18);
    local_180 = 0;
    btAlignedObjectArray<float>::resize
              (in_stack_fffffffffffffbf0,in_stack_fffffffffffffbec,
               (float *)CONCAT44(in_stack_fffffffffffffbe4,in_stack_fffffffffffffbe0));
    if (local_28 == 0) {
      local_194 = (btScalar  [4])operator-((btVector3 *)in_stack_fffffffffffffbd0);
      btAlignedObjectArray<float>::operator[](local_18,local_10[3]);
      in_stack_fffffffffffffbd0 = (btMultiBody *)(local_18 + 5);
      btMultiBody::fillContactJacobianMultiDof
                (in_stack_fffffffffffffc40,link,(btVector3 *)in_stack_fffffffffffffc30,
                 (btVector3 *)normal,
                 (btScalar *)CONCAT44(in_stack_fffffffffffffc24,in_stack_fffffffffffffc20),
                 (btAlignedObjectArray<float> *)in_stack_00000010,
                 (btAlignedObjectArray<btVector3> *)in_stack_fffffffffffffc50,
                 (btAlignedObjectArray<btMatrix3x3> *)
                 CONCAT44(in_stack_fffffffffffffc5c,in_stack_fffffffffffffc58));
    }
    else {
      for (local_184 = 0; local_184 < local_178; local_184 = local_184 + 1) {
        fVar10 = *(float *)(local_28 + (long)local_184 * 4);
        pfVar3 = btAlignedObjectArray<float>::operator[](local_18,local_10[3] + local_184);
        *pfVar3 = fVar10;
      }
    }
    btAlignedObjectArray<float>::size(local_18 + 1);
    local_198 = 0;
    btAlignedObjectArray<float>::resize
              (in_stack_fffffffffffffbf0,in_stack_fffffffffffffbec,
               (float *)CONCAT44(in_stack_fffffffffffffbe4,in_stack_fffffffffffffbe0));
    local_1a0 = btAlignedObjectArray<float>::operator[](local_18 + 1,local_10[3]);
    btAlignedObjectArray<float>::operator[](local_18,local_10[3]);
    btMultiBody::calcAccelerationDeltasMultiDof
              (in_stack_ffffffffffffff40,in_stack_ffffffffffffff30.m_floats._8_8_,
               in_stack_ffffffffffffff30.m_floats._0_8_,in_stack_ffffffffffffff20.m_floats._8_8_,
               in_stack_ffffffffffffff20.m_floats._0_8_);
    local_1b0 = (btScalar  [4])
                btVector3::cross((btVector3 *)
                                 CONCAT44(in_stack_fffffffffffffbe4,in_stack_fffffffffffffbe0),
                                 in_stack_fffffffffffffbd8);
    local_1c0 = (undefined1  [16])operator-((btVector3 *)in_stack_fffffffffffffbd0);
    *(undefined8 *)(local_10 + 0xc) = local_1c0._0_8_;
    *(undefined8 *)(local_10 + 0xe) = local_1c0._8_8_;
    local_1d0 = (undefined1  [16])operator-((btVector3 *)in_stack_fffffffffffffbd0);
    *(undefined8 *)(local_10 + 0x10) = local_1d0._0_8_;
    *(undefined8 *)(local_10 + 0x12) = local_1d0._8_8_;
  }
  btVector3::btVector3(&local_24c);
  local_250 = 0.0;
  local_254 = 0.0;
  local_260 = (float *)0x0;
  local_268 = (float *)0x0;
  local_270 = (float *)0x0;
  local_278 = (float *)0x0;
  local_27c = 0;
  if (local_58 == (btMultiBody *)0x0) {
    if (local_78 != (btRigidBody *)0x0) {
      bVar9 = btVector3::cross((btVector3 *)
                               CONCAT44(in_stack_fffffffffffffbe4,in_stack_fffffffffffffbe0),
                               in_stack_fffffffffffffbd8);
      local_298._0_8_ = bVar9.m_floats._0_8_;
      local_24c.m_floats[0] = local_298[0];
      local_24c.m_floats[1] = local_298[1];
      local_298._8_8_ = bVar9.m_floats._8_8_;
      local_24c.m_floats[2] = local_298[2];
      local_24c.m_floats[3] = local_298[3];
      local_298 = bVar9.m_floats;
      bVar7 = btRigidBody::getInvMass(local_78);
      bVar6 = btVector3::dot(local_30,&local_24c);
      local_250 = bVar7 + bVar6;
    }
  }
  else {
    local_27c = btMultiBody::getNumDofs(local_58);
    local_27c = local_27c + 6;
    local_268 = btAlignedObjectArray<float>::operator[](local_18,local_10[1]);
    local_270 = btAlignedObjectArray<float>::operator[](local_18 + 1,local_10[1]);
    for (local_280 = 0; local_280 < local_27c; local_280 = local_280 + 1) {
      local_284 = local_268[local_280];
      local_288 = local_270[local_280];
      local_250 = local_284 * local_288 + local_250;
    }
  }
  if (local_60 == (btMultiBody *)0x0) {
    if (local_80 != (btRigidBody *)0x0) {
      local_2c8 = (btScalar  [4])operator-((btVector3 *)in_stack_fffffffffffffbd0);
      bVar9 = btVector3::cross((btVector3 *)
                               CONCAT44(in_stack_fffffffffffffbe4,in_stack_fffffffffffffbe0),
                               in_stack_fffffffffffffbd8);
      local_2b8._0_8_ = bVar9.m_floats._0_8_;
      local_24c.m_floats[0] = local_2b8[0];
      local_24c.m_floats[1] = local_2b8[1];
      local_2b8._8_8_ = bVar9.m_floats._8_8_;
      local_24c.m_floats[2] = local_2b8[2];
      local_24c.m_floats[3] = local_2b8[3];
      local_2b8 = bVar9.m_floats;
      bVar7 = btRigidBody::getInvMass(local_80);
      bVar6 = btVector3::dot(local_30,&local_24c);
      local_254 = bVar7 + bVar6;
    }
  }
  else {
    local_29c = btMultiBody::getNumDofs(local_60);
    local_29c = local_29c + 6;
    local_260 = btAlignedObjectArray<float>::operator[](local_18,local_10[3]);
    local_278 = btAlignedObjectArray<float>::operator[](local_18 + 1,local_10[3]);
    for (local_2a0 = 0; local_2a0 < local_29c; local_2a0 = local_2a0 + 1) {
      local_2a4 = local_260[local_2a0];
      local_2a8 = local_278[local_2a0];
      local_254 = local_2a4 * local_2a8 + local_254;
    }
  }
  local_2cc = local_250 + local_254;
  if (local_2cc <= 1.1920929e-07) {
    local_10[0x1f] = 0;
  }
  else {
    local_10[0x1f] = (int)(local_40 / local_2cc);
  }
  if ((local_41 & 1) == 0) {
    fVar10 = local_34 + *(float *)(in_stack_00000018 + 0x38);
  }
  else {
    fVar10 = 0.0;
  }
  local_2d4 = 0.0;
  local_2d8 = 0;
  local_2dc = 0;
  local_2d0 = fVar10;
  btVector3::btVector3(&local_2ec);
  btVector3::btVector3(&local_2fc);
  if (local_58 == (btMultiBody *)0x0) {
    if (local_78 != (btRigidBody *)0x0) {
      local_31c = btRigidBody::getVelocityInLocalPoint
                            ((btRigidBody *)CONCAT44(fVar10,in_stack_fffffffffffffbe0),
                             in_stack_fffffffffffffbd8);
      bVar7 = btVector3::dot(&local_31c,(btVector3 *)(local_10 + 8));
      local_2d4 = bVar7 + local_2d4;
    }
  }
  else {
    local_2d8 = btMultiBody::getNumDofs(local_58);
    local_2d8 = local_2d8 + 6;
    local_308 = btAlignedObjectArray<float>::operator[](local_18,local_10[1]);
    for (local_30c = 0; local_30c < local_2d8; local_30c = local_30c + 1) {
      pbVar5 = btMultiBody::getVelocityVector((btMultiBody *)0x255548);
      local_2d4 = pbVar5[local_30c] * local_308[local_30c] + local_2d4;
    }
  }
  if (local_60 == (btMultiBody *)0x0) {
    if (local_80 != (btRigidBody *)0x0) {
      local_33c = btRigidBody::getVelocityInLocalPoint
                            ((btRigidBody *)CONCAT44(fVar10,in_stack_fffffffffffffbe0),
                             in_stack_fffffffffffffbd8);
      bVar7 = btVector3::dot(&local_33c,(btVector3 *)(local_10 + 0x10));
      local_2d4 = bVar7 + local_2d4;
    }
  }
  else {
    local_2dc = btMultiBody::getNumDofs(local_60);
    local_2dc = local_2dc + 6;
    local_328 = btAlignedObjectArray<float>::operator[](local_18,local_10[3]);
    for (local_32c = 0; local_32c < local_2dc; local_32c = local_32c + 1) {
      pbVar5 = btMultiBody::getVelocityVector((btMultiBody *)0x255666);
      local_2d4 = pbVar5[local_32c] * local_328[local_32c] + local_2d4;
    }
  }
  local_10[0x1e] = 0;
  local_10[0x1d] = 0;
  local_10[0x1c] = 0;
  local_348 = *(float *)(in_stack_00000018 + 0x24);
  if ((*(int *)(in_stack_00000018 + 0x2c) == 0) ||
     (*(float *)(in_stack_00000018 + 0x30) <= local_2d0 &&
      local_2d0 != *(float *)(in_stack_00000018 + 0x30))) {
    local_348 = *(float *)(in_stack_00000018 + 0x20);
  }
  fVar10 = ((-local_2d0 * local_348) / *(float *)(in_stack_00000018 + 0xc)) * (float)local_10[0x1f];
  fVar8 = (local_48 - local_2d4) * (float)local_10[0x1f];
  if ((*(int *)(in_stack_00000018 + 0x2c) == 0) ||
     (*(float *)(in_stack_00000018 + 0x30) <= local_2d0 &&
      local_2d0 != *(float *)(in_stack_00000018 + 0x30))) {
    local_10[0x20] = (int)(fVar10 + fVar8);
    local_10[0x24] = 0;
  }
  else {
    local_10[0x20] = (int)fVar8;
    local_10[0x24] = (int)fVar10;
  }
  local_10[0x21] = 0;
  local_10[0x22] = local_38;
  local_10[0x23] = local_3c;
  return local_2d4;
}

Assistant:

btScalar btMultiBodyConstraint::fillMultiBodyConstraint(	btMultiBodySolverConstraint& solverConstraint,
															btMultiBodyJacobianData& data,
															btScalar* jacOrgA, btScalar* jacOrgB,
															const btVector3& contactNormalOnB,
															const btVector3& posAworld, const btVector3& posBworld,
															btScalar posError,
															const btContactSolverInfo& infoGlobal,
															btScalar lowerLimit, btScalar upperLimit,
															btScalar relaxation,
															bool isFriction, btScalar desiredVelocity, btScalar cfmSlip)
{


	solverConstraint.m_multiBodyA = m_bodyA;
	solverConstraint.m_multiBodyB = m_bodyB;
	solverConstraint.m_linkA = m_linkA;
	solverConstraint.m_linkB = m_linkB;

	btMultiBody* multiBodyA = solverConstraint.m_multiBodyA;
	btMultiBody* multiBodyB = solverConstraint.m_multiBodyB;

	btSolverBody* bodyA = multiBodyA ? 0 : &data.m_solverBodyPool->at(solverConstraint.m_solverBodyIdA);
	btSolverBody* bodyB = multiBodyB ? 0 : &data.m_solverBodyPool->at(solverConstraint.m_solverBodyIdB);

	btRigidBody* rb0 = multiBodyA ? 0 : bodyA->m_originalBody;
	btRigidBody* rb1 = multiBodyB ? 0 : bodyB->m_originalBody;

	btVector3 rel_pos1, rel_pos2;				//these two used to be inited to posAworld and posBworld (respectively) but it does not seem necessary
	if (bodyA)
		rel_pos1 = posAworld - bodyA->getWorldTransform().getOrigin();
	if (bodyB)
		rel_pos2 = posBworld - bodyB->getWorldTransform().getOrigin();

	if (multiBodyA)
	{
		if (solverConstraint.m_linkA<0)
		{
			rel_pos1 = posAworld - multiBodyA->getBasePos();
		} else
		{
			rel_pos1 = posAworld - multiBodyA->getLink(solverConstraint.m_linkA).m_cachedWorldTransform.getOrigin();
		}

		const int ndofA  = multiBodyA->getNumDofs() + 6;

		solverConstraint.m_deltaVelAindex = multiBodyA->getCompanionId();

		if (solverConstraint.m_deltaVelAindex <0)
		{
			solverConstraint.m_deltaVelAindex = data.m_deltaVelocities.size();
			multiBodyA->setCompanionId(solverConstraint.m_deltaVelAindex);
			data.m_deltaVelocities.resize(data.m_deltaVelocities.size()+ndofA);
		} else
		{
			btAssert(data.m_deltaVelocities.size() >= solverConstraint.m_deltaVelAindex+ndofA);
		}

		//determine jacobian of this 1D constraint in terms of multibodyA's degrees of freedom
		//resize..
		solverConstraint.m_jacAindex = data.m_jacobians.size();
		data.m_jacobians.resize(data.m_jacobians.size()+ndofA);
		//copy/determine
		if(jacOrgA)
		{
			for (int i=0;i<ndofA;i++)
				data.m_jacobians[solverConstraint.m_jacAindex+i] = jacOrgA[i];
		}
		else
		{
			btScalar* jac1=&data.m_jacobians[solverConstraint.m_jacAindex];
			multiBodyA->fillContactJacobianMultiDof(solverConstraint.m_linkA, posAworld, contactNormalOnB, jac1, data.scratch_r, data.scratch_v, data.scratch_m);
		}

		//determine the velocity response of multibodyA to reaction impulses of this constraint (i.e. A[i,i] for i=1,...n_con: multibody's inverse inertia with respect to this 1D constraint)
		//resize..
		data.m_deltaVelocitiesUnitImpulse.resize(data.m_deltaVelocitiesUnitImpulse.size()+ndofA);		//=> each constraint row has the constrained tree dofs allocated in m_deltaVelocitiesUnitImpulse
		btAssert(data.m_jacobians.size() == data.m_deltaVelocitiesUnitImpulse.size());
		btScalar* delta = &data.m_deltaVelocitiesUnitImpulse[solverConstraint.m_jacAindex];
		//determine..
		multiBodyA->calcAccelerationDeltasMultiDof(&data.m_jacobians[solverConstraint.m_jacAindex],delta,data.scratch_r, data.scratch_v);

		btVector3 torqueAxis0 = rel_pos1.cross(contactNormalOnB);
		solverConstraint.m_relpos1CrossNormal = torqueAxis0;
		solverConstraint.m_contactNormal1 = contactNormalOnB;
	}
	else //if(rb0)
	{
		btVector3 torqueAxis0 = rel_pos1.cross(contactNormalOnB);
		solverConstraint.m_angularComponentA = rb0 ? rb0->getInvInertiaTensorWorld()*torqueAxis0*rb0->getAngularFactor() : btVector3(0,0,0);
		solverConstraint.m_relpos1CrossNormal = torqueAxis0;
		solverConstraint.m_contactNormal1 = contactNormalOnB;
	}

	if (multiBodyB)
	{
		if (solverConstraint.m_linkB<0)
		{
			rel_pos2 = posBworld - multiBodyB->getBasePos();
		} else
		{
			rel_pos2 = posBworld - multiBodyB->getLink(solverConstraint.m_linkB).m_cachedWorldTransform.getOrigin();
		}

		const int ndofB  = multiBodyB->getNumDofs() + 6;

		solverConstraint.m_deltaVelBindex = multiBodyB->getCompanionId();
		if (solverConstraint.m_deltaVelBindex <0)
		{
			solverConstraint.m_deltaVelBindex = data.m_deltaVelocities.size();
			multiBodyB->setCompanionId(solverConstraint.m_deltaVelBindex);
			data.m_deltaVelocities.resize(data.m_deltaVelocities.size()+ndofB);
		}

		//determine jacobian of this 1D constraint in terms of multibodyB's degrees of freedom
		//resize..
		solverConstraint.m_jacBindex = data.m_jacobians.size();
		data.m_jacobians.resize(data.m_jacobians.size()+ndofB);
		//copy/determine..
		if(jacOrgB)
		{
			for (int i=0;i<ndofB;i++)
				data.m_jacobians[solverConstraint.m_jacBindex+i] = jacOrgB[i];
		}
		else
		{
			multiBodyB->fillContactJacobianMultiDof(solverConstraint.m_linkB, posBworld, -contactNormalOnB, &data.m_jacobians[solverConstraint.m_jacBindex], data.scratch_r, data.scratch_v, data.scratch_m);
		}

		//determine velocity response of multibodyB to reaction impulses of this constraint (i.e. A[i,i] for i=1,...n_con: multibody's inverse inertia with respect to this 1D constraint)
		//resize..
		data.m_deltaVelocitiesUnitImpulse.resize(data.m_deltaVelocitiesUnitImpulse.size()+ndofB);
		btAssert(data.m_jacobians.size() == data.m_deltaVelocitiesUnitImpulse.size());
		btScalar* delta = &data.m_deltaVelocitiesUnitImpulse[solverConstraint.m_jacBindex];
		//determine..
		multiBodyB->calcAccelerationDeltasMultiDof(&data.m_jacobians[solverConstraint.m_jacBindex],delta,data.scratch_r, data.scratch_v);

		btVector3 torqueAxis1 = rel_pos2.cross(contactNormalOnB);
		solverConstraint.m_relpos2CrossNormal = -torqueAxis1;
		solverConstraint.m_contactNormal2 = -contactNormalOnB;

	}
	else //if(rb1)
	{
		btVector3 torqueAxis1 = rel_pos2.cross(contactNormalOnB);
		solverConstraint.m_angularComponentB = rb1 ? rb1->getInvInertiaTensorWorld()*-torqueAxis1*rb1->getAngularFactor() : btVector3(0,0,0);
		solverConstraint.m_relpos2CrossNormal = -torqueAxis1;
		solverConstraint.m_contactNormal2 = -contactNormalOnB;
	}
	{

		btVector3 vec;
		btScalar denom0 = 0.f;
		btScalar denom1 = 0.f;
		btScalar* jacB = 0;
		btScalar* jacA = 0;
		btScalar* deltaVelA = 0;
		btScalar* deltaVelB = 0;
		int ndofA  = 0;
		//determine the "effective mass" of the constrained multibodyA with respect to this 1D constraint (i.e. 1/A[i,i])
		if (multiBodyA)
		{
			ndofA = multiBodyA->getNumDofs() + 6;
			jacA = &data.m_jacobians[solverConstraint.m_jacAindex];
			deltaVelA = &data.m_deltaVelocitiesUnitImpulse[solverConstraint.m_jacAindex];
			for (int i = 0; i < ndofA; ++i)
			{
				btScalar j = jacA[i] ;
				btScalar l = deltaVelA[i];
				denom0 += j*l;
			}
		}
		else if(rb0)
		{
			vec = ( solverConstraint.m_angularComponentA).cross(rel_pos1);
			denom0 = rb0->getInvMass() + contactNormalOnB.dot(vec);
		}
		//
		if (multiBodyB)
		{
			const int ndofB = multiBodyB->getNumDofs() + 6;
			jacB = &data.m_jacobians[solverConstraint.m_jacBindex];
			deltaVelB = &data.m_deltaVelocitiesUnitImpulse[solverConstraint.m_jacBindex];
			for (int i = 0; i < ndofB; ++i)
			{
				btScalar j = jacB[i] ;
				btScalar l = deltaVelB[i];
				denom1 += j*l;
			}

		}
		else if(rb1)
		{
			vec = ( -solverConstraint.m_angularComponentB).cross(rel_pos2);
			denom1 = rb1->getInvMass() + contactNormalOnB.dot(vec);
		}

		//
		btScalar d = denom0+denom1;
		if (d>SIMD_EPSILON)
		{
			solverConstraint.m_jacDiagABInv = relaxation/(d);
		}
		else
		{
		//disable the constraint row to handle singularity/redundant constraint
			solverConstraint.m_jacDiagABInv  = 0.f;
		}
	}


	//compute rhs and remaining solverConstraint fields
	btScalar penetration = isFriction? 0 : posError+infoGlobal.m_linearSlop;

	btScalar rel_vel = 0.f;
	int ndofA  = 0;
	int ndofB  = 0;
	{
		btVector3 vel1,vel2;
		if (multiBodyA)
		{
			ndofA = multiBodyA->getNumDofs() + 6;
			btScalar* jacA = &data.m_jacobians[solverConstraint.m_jacAindex];
			for (int i = 0; i < ndofA ; ++i)
				rel_vel += multiBodyA->getVelocityVector()[i] * jacA[i];
		}
		else if(rb0)
		{
			rel_vel += rb0->getVelocityInLocalPoint(rel_pos1).dot(solverConstraint.m_contactNormal1);
		}
		if (multiBodyB)
		{
			ndofB = multiBodyB->getNumDofs() + 6;
			btScalar* jacB = &data.m_jacobians[solverConstraint.m_jacBindex];
			for (int i = 0; i < ndofB ; ++i)
				rel_vel += multiBodyB->getVelocityVector()[i] * jacB[i];

		}
		else if(rb1)
		{
			rel_vel += rb1->getVelocityInLocalPoint(rel_pos2).dot(solverConstraint.m_contactNormal2);
		}

		solverConstraint.m_friction = 0.f;//cp.m_combinedFriction;
	}


	///warm starting (or zero if disabled)
	/*
	if (infoGlobal.m_solverMode & SOLVER_USE_WARMSTARTING)
	{
		solverConstraint.m_appliedImpulse = isFriction ? 0 : cp.m_appliedImpulse * infoGlobal.m_warmstartingFactor;

		if (solverConstraint.m_appliedImpulse)
		{
			if (multiBodyA)
			{
				btScalar impulse = solverConstraint.m_appliedImpulse;
				btScalar* deltaV = &data.m_deltaVelocitiesUnitImpulse[solverConstraint.m_jacAindex];
				multiBodyA->applyDeltaVee(deltaV,impulse);
				applyDeltaVee(data,deltaV,impulse,solverConstraint.m_deltaVelAindex,ndofA);
			} else
			{
				if (rb0)
					bodyA->internalApplyImpulse(solverConstraint.m_contactNormal1*bodyA->internalGetInvMass()*rb0->getLinearFactor(),solverConstraint.m_angularComponentA,solverConstraint.m_appliedImpulse);
			}
			if (multiBodyB)
			{
				btScalar impulse = solverConstraint.m_appliedImpulse;
				btScalar* deltaV = &data.m_deltaVelocitiesUnitImpulse[solverConstraint.m_jacBindex];
				multiBodyB->applyDeltaVee(deltaV,impulse);
				applyDeltaVee(data,deltaV,impulse,solverConstraint.m_deltaVelBindex,ndofB);
			} else
			{
				if (rb1)
					bodyB->internalApplyImpulse(-solverConstraint.m_contactNormal2*bodyB->internalGetInvMass()*rb1->getLinearFactor(),-solverConstraint.m_angularComponentB,-(btScalar)solverConstraint.m_appliedImpulse);
			}
		}
	} else
	*/

	solverConstraint.m_appliedImpulse = 0.f;
	solverConstraint.m_appliedPushImpulse = 0.f;

	{

		btScalar positionalError = 0.f;
		btScalar	velocityError = desiredVelocity - rel_vel;// * damping;


		btScalar erp = infoGlobal.m_erp2;
		if (!infoGlobal.m_splitImpulse || (penetration > infoGlobal.m_splitImpulsePenetrationThreshold))
		{
			erp = infoGlobal.m_erp;
		}

		positionalError = -penetration * erp/infoGlobal.m_timeStep;

		btScalar  penetrationImpulse = positionalError*solverConstraint.m_jacDiagABInv;
		btScalar velocityImpulse = velocityError *solverConstraint.m_jacDiagABInv;

		if (!infoGlobal.m_splitImpulse || (penetration > infoGlobal.m_splitImpulsePenetrationThreshold))
		{
			//combine position and velocity into rhs
			solverConstraint.m_rhs = penetrationImpulse+velocityImpulse;
			solverConstraint.m_rhsPenetration = 0.f;

		} else
		{
			//split position and velocity into rhs and m_rhsPenetration
			solverConstraint.m_rhs = velocityImpulse;
			solverConstraint.m_rhsPenetration = penetrationImpulse;
		}

		solverConstraint.m_cfm = 0.f;
		solverConstraint.m_lowerLimit = lowerLimit;
		solverConstraint.m_upperLimit = upperLimit;
	}

	return rel_vel;

}